

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O1

void __thiscall nuraft::timer_helper::set_duration_us(timer_helper *this,size_t us)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar1 == 0) {
    this->duration_us_ = us;
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void set_duration_us(size_t us) {
        std::lock_guard<std::mutex> l(lock_);
        duration_us_ = us;
    }